

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O2

bool __thiscall QAccessibleCache::containsObject(QAccessibleCache *this,QObject *obj)

{
  QMetaObject **ppQVar1;
  bool bVar2;
  QMetaObject *pQVar3;
  iterator iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_> local_40;
  QObject *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = obj;
  if (obj == (QObject *)0x0) {
LAB_004fa623:
    bVar2 = false;
  }
  else {
    pQVar3 = (QMetaObject *)(*(code *)**(undefined8 **)obj)(obj);
    QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::valuesImpl<QObject*>
              ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40,
               (QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)(this + 0x20),
               &local_28);
    iVar4 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin
                      ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40);
    iVar5 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end
                      ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)&local_40);
    do {
      if (iVar4.i == iVar5.i) {
        QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QArrayDataPointer
                  (&local_40);
        goto LAB_004fa623;
      }
      ppQVar1 = &(iVar4.i)->second;
      iVar4.i = iVar4.i + 1;
    } while (*ppQVar1 != pQVar3);
    QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QArrayDataPointer(&local_40);
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleCache::containsObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return true;
            }
        }
    }
    return false;
}